

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * phyr::Transform::rotateZ(double theta)

{
  Transform *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double sinTheta;
  double cosTheta;
  Mat4x4 m;
  Mat4x4 *in_stack_fffffffffffffd90;
  Mat4x4 *in_stack_fffffffffffffd98;
  Transform *in_stack_fffffffffffffda0;
  Mat4x4 *in_stack_fffffffffffffdd0;
  _Mat4x4 local_198;
  _Mat4x4 local_118;
  double local_98;
  double local_90;
  _Mat4x4 local_88;
  double local_8;
  
  local_8 = in_XMM0_Qa;
  _Mat4x4::_Mat4x4(&local_88);
  dVar1 = radians(local_8);
  local_90 = cos(dVar1);
  dVar1 = radians(local_8);
  local_98 = sin(dVar1);
  if ((local_8 != 0.0) || (NAN(local_8))) {
    in_stack_fffffffffffffdd0 = (Mat4x4 *)0x0;
    in_stack_fffffffffffffd90 = (Mat4x4 *)0x0;
    in_stack_fffffffffffffd98 = (Mat4x4 *)0x3ff0000000000000;
    in_stack_fffffffffffffda0 = (Transform *)0x0;
    _Mat4x4::_Mat4x4(&local_198,local_90,-local_98,0.0,0.0,local_98,local_90,0.0,0.0,0.0,0.0,1.0,0.0
                     ,0.0,0.0,0.0,1.0);
    memcpy(&local_88,&local_198,0x80);
  }
  else {
    _Mat4x4::_Mat4x4(&local_118);
    memcpy(&local_88,&local_118,0x80);
  }
  _Mat4x4::transpose(in_stack_fffffffffffffdd0);
  Transform(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  return in_RDI;
}

Assistant:

Transform Transform::rotateZ(Real theta) {
    Mat4x4 m;
    Real cosTheta = std::cos(radians(theta));
    Real sinTheta = std::sin(radians(theta));

    if (theta == 0.0)
        m = Mat4x4(); // Identity
    else {
        m = Mat4x4( cosTheta, -sinTheta, 0, 0,
                    sinTheta,  cosTheta, 0, 0,
                          0,          0, 1, 0,
                          0,          0, 0, 1);
    }

    return Transform(m, Mat4x4::transpose(m));
}